

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_info_subject_alt_name
              (char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name,char *prefix)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong uVar5;
  size_t size_00;
  bool bVar6;
  char *local_128;
  uchar *ip;
  char *rfc822_name;
  char *dns_name;
  mbedtls_x509_san_other_name *other_name;
  undefined1 local_d0 [4];
  int parse_ret;
  mbedtls_x509_subject_alternative_name san;
  mbedtls_x509_sequence *cur;
  char *p;
  size_t n;
  size_t i;
  int ret;
  char *prefix_local;
  mbedtls_x509_sequence *subject_alt_name_local;
  size_t *size_local;
  char **buf_local;
  
  p = (char *)*size;
  cur = (mbedtls_x509_sequence *)*buf;
  san.san._64_8_ = subject_alt_name;
  do {
    while( true ) {
      if (san.san._64_8_ == 0) {
        *(undefined1 *)&(cur->buf).tag = 0;
        *size = (size_t)p;
        *buf = (char *)cur;
        return 0;
      }
      memset(local_d0,0,0x50);
      iVar1 = mbedtls_x509_parse_subject_alt_name
                        ((mbedtls_x509_buf *)san.san._64_8_,
                         (mbedtls_x509_subject_alternative_name *)local_d0);
      if (iVar1 == 0) break;
      if (iVar1 == -0x2080) {
        iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    <unsupported>",prefix);
        if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
          return -0x2980;
        }
      }
      else {
        iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    <malformed>",prefix);
        if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
          return -0x2980;
        }
      }
      p = p + -(long)iVar1;
      cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)iVar1);
      san.san._64_8_ = *(undefined8 *)(san.san._64_8_ + 0x18);
    }
    switch(local_d0) {
    case (undefined1  [4])0x0:
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    otherName :",prefix);
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      p = p + -(long)iVar1;
      cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)iVar1);
      bVar6 = true;
      if (san.san._0_8_ == 8) {
        iVar1 = memcmp("+\x06\x01\x05\x05\a\b\x04",(void *)san.san.other_name.type_id.len,8);
        bVar6 = iVar1 != 0;
      }
      if (!bVar6) {
        iVar1 = snprintf((char *)cur,(size_t)p,"\n%s        hardware module name :",prefix);
        if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
          return -0x2980;
        }
        uVar5 = (long)p - (long)iVar1;
        pcVar3 = (char *)((long)&(cur->buf).tag + (long)iVar1);
        iVar1 = snprintf(pcVar3,uVar5,"\n%s            hardware type          : ",prefix);
        if ((iVar1 < 0) || (uVar5 <= (ulong)(long)iVar1)) {
          return -0x2980;
        }
        uVar5 = uVar5 - (long)iVar1;
        pcVar3 = pcVar3 + iVar1;
        iVar1 = mbedtls_oid_get_numeric_string
                          (pcVar3,uVar5,(mbedtls_asn1_buf *)&san.san.directory_name.oid.p);
        if ((iVar1 < 0) || (uVar5 <= (ulong)(long)iVar1)) {
          return -0x2980;
        }
        uVar5 = uVar5 - (long)iVar1;
        iVar2 = snprintf(pcVar3 + iVar1,uVar5,"\n%s            hardware serial number : ",prefix);
        if ((iVar2 < 0) || (uVar5 <= (ulong)(long)iVar2)) {
          return -0x2980;
        }
        p = (char *)(uVar5 - (long)iVar2);
        cur = (mbedtls_x509_sequence *)(pcVar3 + iVar1 + iVar2);
        for (n = 0; n < san.san.directory_name.next; n = n + 1) {
          iVar1 = snprintf((char *)cur,(size_t)p,"%02X",(ulong)*(byte *)(san.san._56_8_ + n));
          if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
            return -0x2980;
          }
          p = p + -(long)iVar1;
          cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)iVar1);
        }
      }
      break;
    case (undefined1  [4])0x1:
    case (undefined1  [4])0x2:
      if (local_d0 == (undefined1  [4])0x2) {
        local_128 = "dNSName";
      }
      else {
        local_128 = "rfc822Name";
      }
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    %s : ",prefix,local_128);
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      uVar5 = (long)p - (long)iVar1;
      puVar4 = (undefined1 *)((long)&(cur->buf).tag + (long)iVar1);
      if (uVar5 <= (ulong)san.san._0_8_) {
        if (uVar5 != 0) {
          *puVar4 = 0;
        }
        return -0x2980;
      }
      memcpy(puVar4,(void *)san.san.other_name.type_id.len,san.san._0_8_);
      cur = (mbedtls_x509_sequence *)(puVar4 + san.san._0_8_);
      p = (char *)(uVar5 - san.san._0_8_);
      break;
    default:
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    <unsupported>",prefix);
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      p = p + -(long)iVar1;
      cur = (mbedtls_x509_sequence *)((long)&(cur->buf).tag + (long)iVar1);
      break;
    case (undefined1  [4])0x4:
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    directoryName : ",prefix);
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)local_d0);
      }
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      size_00 = (long)p - (long)iVar1;
      pcVar3 = (char *)((long)&(cur->buf).tag + (long)iVar1);
      iVar1 = mbedtls_x509_dn_gets(pcVar3,size_00,(mbedtls_x509_name *)&san);
      if (iVar1 < 0) {
        mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)local_d0);
        if (size_00 == 0) {
          return iVar1;
        }
        *pcVar3 = '\0';
        return iVar1;
      }
      cur = (mbedtls_x509_sequence *)(pcVar3 + iVar1);
      p = (char *)(size_00 - (long)iVar1);
      break;
    case (undefined1  [4])0x6:
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    uniformResourceIdentifier : ",prefix);
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      uVar5 = (long)p - (long)iVar1;
      puVar4 = (undefined1 *)((long)&(cur->buf).tag + (long)iVar1);
      if (uVar5 <= (ulong)san.san._0_8_) {
        if (uVar5 != 0) {
          *puVar4 = 0;
        }
        return -0x2980;
      }
      memcpy(puVar4,(void *)san.san.other_name.type_id.len,san.san._0_8_);
      cur = (mbedtls_x509_sequence *)(puVar4 + san.san._0_8_);
      p = (char *)(uVar5 - san.san._0_8_);
      break;
    case (undefined1  [4])0x7:
      iVar1 = snprintf((char *)cur,(size_t)p,"\n%s    %s : ",prefix,"iPAddress");
      if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
        return -0x2980;
      }
      uVar5 = (long)p - (long)iVar1;
      pcVar3 = (char *)((long)&(cur->buf).tag + (long)iVar1);
      if (uVar5 <= (ulong)san.san._0_8_) {
        if (uVar5 != 0) {
          *pcVar3 = '\0';
        }
        return -0x2980;
      }
      if (san.san._0_8_ == 4) {
        iVar1 = snprintf(pcVar3,uVar5,"%u.%u.%u.%u",(ulong)*(byte *)san.san.other_name.type_id.len,
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 3));
        if ((iVar1 < 0) || (uVar5 <= (ulong)(long)iVar1)) {
          return -0x2980;
        }
      }
      else {
        if (san.san._0_8_ != 0x10) {
          if (uVar5 != 0) {
            *pcVar3 = '\0';
          }
          return -0x2800;
        }
        iVar1 = snprintf(pcVar3,uVar5,"%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                         (ulong)*(byte *)san.san.other_name.type_id.len,
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                         (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 3),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 4),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 5),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 6),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 7),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 8),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 9),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 10),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 0xb),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 0xc),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 0xd),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 0xe),
                         (uint)*(byte *)(san.san.other_name.type_id.len + 0xf));
        if ((iVar1 < 0) || (uVar5 <= (ulong)(long)iVar1)) {
          return -0x2980;
        }
      }
      p = (char *)(uVar5 - (long)iVar1);
      cur = (mbedtls_x509_sequence *)(pcVar3 + iVar1);
    }
    mbedtls_x509_free_subject_alt_name((mbedtls_x509_subject_alternative_name *)local_d0);
    san.san._64_8_ = *(undefined8 *)(san.san._64_8_ + 0x18);
  } while( true );
}

Assistant:

int mbedtls_x509_info_subject_alt_name(char **buf, size_t *size,
                                       const mbedtls_x509_sequence
                                       *subject_alt_name,
                                       const char *prefix)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    mbedtls_x509_subject_alternative_name san;
    int parse_ret;

    while (cur != NULL) {
        memset(&san, 0, sizeof(san));
        parse_ret = mbedtls_x509_parse_subject_alt_name(&cur->buf, &san);
        if (parse_ret != 0) {
            if (parse_ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            } else {
                ret = mbedtls_snprintf(p, n, "\n%s    <malformed>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            }
            cur = cur->next;
            continue;
        }

        switch (san.type) {
            /*
             * otherName
             */
            case MBEDTLS_X509_SAN_OTHER_NAME:
            {
                mbedtls_x509_san_other_name *other_name = &san.san.other_name;

                ret = mbedtls_snprintf(p, n, "\n%s    otherName :", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;

                if (MBEDTLS_OID_CMP(MBEDTLS_OID_ON_HW_MODULE_NAME,
                                    &other_name->type_id) == 0) {
                    ret = mbedtls_snprintf(p, n, "\n%s        hardware module name :", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware type          : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret = mbedtls_oid_get_numeric_string(p,
                                                         n,
                                                         &other_name->value.hardware_module_name.oid);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware serial number : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    for (i = 0; i < other_name->value.hardware_module_name.val.len; i++) {
                        ret = mbedtls_snprintf(p,
                                               n,
                                               "%02X",
                                               other_name->value.hardware_module_name.val.p[i]);
                        MBEDTLS_X509_SAFE_SNPRINTF;
                    }
                }/* MBEDTLS_OID_ON_HW_MODULE_NAME */
            }
            break;
            /*
             * uniformResourceIdentifier
             */
            case MBEDTLS_X509_SAN_UNIFORM_RESOURCE_IDENTIFIER:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    uniformResourceIdentifier : ", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * dNSName
             * RFC822 Name
             */
            case MBEDTLS_X509_SAN_DNS_NAME:
            case MBEDTLS_X509_SAN_RFC822_NAME:
            {
                const char *dns_name = "dNSName";
                const char *rfc822_name = "rfc822Name";

                ret = mbedtls_snprintf(p, n,
                                       "\n%s    %s : ",
                                       prefix,
                                       san.type ==
                                       MBEDTLS_X509_SAN_DNS_NAME ? dns_name : rfc822_name);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * iPAddress
             */
            case MBEDTLS_X509_SAN_IP_ADDRESS:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    %s : ",
                                       prefix, "iPAddress");
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                unsigned char *ip = san.san.unstructured_name.p;
                // Only IPv6 (16 bytes) and IPv4 (4 bytes) types are supported
                if (san.san.unstructured_name.len == 4) {
                    ret = mbedtls_snprintf(p, n, "%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else if (san.san.unstructured_name.len == 16) {
                    ret = mbedtls_snprintf(p, n,
                                           "%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                                           ip[0], ip[1], ip[2], ip[3], ip[4], ip[5], ip[6],
                                           ip[7], ip[8], ip[9], ip[10], ip[11], ip[12], ip[13],
                                           ip[14], ip[15]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
                }
            }
            break;
            /*
             * directoryName
             */
            case MBEDTLS_X509_SAN_DIRECTORY_NAME:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    directoryName : ", prefix);
                if (ret < 0 || (size_t) ret >= n) {
                    mbedtls_x509_free_subject_alt_name(&san);
                }

                MBEDTLS_X509_SAFE_SNPRINTF;
                ret = mbedtls_x509_dn_gets(p, n, &san.san.directory_name);

                if (ret < 0) {
                    mbedtls_x509_free_subject_alt_name(&san);
                    if (n > 0) {
                        *p = '\0';
                    }
                    return ret;
                }

                p += ret;
                n -= ret;
            }
            break;
            /*
             * Type not supported, skip item.
             */
            default:
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                break;
        }

        /* So far memory is freed only in the case of directoryName
         * parsing succeeding, as mbedtls_x509_get_name allocates memory. */
        mbedtls_x509_free_subject_alt_name(&san);
        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return 0;
}